

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O3

int code_index_in_array(char **code_name,char *code)

{
  int iVar1;
  char *__s1;
  long lVar2;
  
  __s1 = *code_name;
  if (__s1 != (char *)0x0) {
    lVar2 = 0;
    do {
      iVar1 = strcmp(__s1,code);
      if (iVar1 == 0) {
        return (int)lVar2;
      }
      __s1 = code_name[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (__s1 != (char *)0x0);
  }
  return -1;
}

Assistant:

int code_index_in_array(const char *code_name[], const char *code)
{
	int i = 0;

	while (code_name[i]) {
		if (streq(code_name[i], code)) {
			return i;
		}
		i++;
	}

	return -1;
}